

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMInterpreter.cpp
# Opt level: O0

BasicValue * __thiscall
cmm::CMMInterpreter::evaluateBinRelation
          (BasicValue *__return_storage_ptr__,CMMInterpreter *this,OperatorKind OpKind,
          BasicValue *LHS,BasicValue *RHS)

{
  OperatorKind OpKind_00;
  bool bVar1;
  double dVar2;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator local_e1;
  string local_e0;
  BasicValue local_b0;
  BasicValue local_70;
  BasicValue *local_30;
  BasicValue *RHS_local;
  BasicValue *LHS_local;
  CMMInterpreter *pCStack_18;
  OperatorKind OpKind_local;
  CMMInterpreter *this_local;
  
  local_30 = RHS;
  RHS_local = LHS;
  LHS_local._4_4_ = OpKind;
  pCStack_18 = this;
  this_local = (CMMInterpreter *)__return_storage_ptr__;
  if (LHS->Type != RHS->Type) {
    bVar1 = cvm::BasicValue::isNumeric(LHS);
    if ((bVar1) && (bVar1 = cvm::BasicValue::isNumeric(RHS), OpKind_00 = LHS_local._4_4_, bVar1)) {
      dVar2 = cvm::BasicValue::toDouble(LHS);
      cvm::BasicValue::BasicValue(&local_70,dVar2);
      dVar2 = cvm::BasicValue::toDouble(RHS);
      cvm::BasicValue::BasicValue(&local_b0,dVar2);
      evaluateBinRelation(__return_storage_ptr__,this,OpKind_00,&local_70,&local_b0);
      cvm::BasicValue::~BasicValue(&local_b0);
      cvm::BasicValue::~BasicValue(&local_70);
      return __return_storage_ptr__;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e0,"relational operator should apply to identical type",&local_e1);
    RuntimeError(this,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  switch(LHS_local._4_4_) {
  case LessEqual:
    bVar1 = cvm::BasicValue::operator<=(LHS,RHS);
    cvm::BasicValue::BasicValue(__return_storage_ptr__,bVar1);
    break;
  case Equal:
    bVar1 = cvm::BasicValue::operator==(LHS,RHS);
    cvm::BasicValue::BasicValue(__return_storage_ptr__,bVar1);
    break;
  case NotEqual:
    bVar1 = cvm::BasicValue::operator!=(LHS,RHS);
    cvm::BasicValue::BasicValue(__return_storage_ptr__,bVar1);
    break;
  case Greater:
    bVar1 = cvm::BasicValue::operator>(LHS,RHS);
    cvm::BasicValue::BasicValue(__return_storage_ptr__,bVar1);
    break;
  case GreaterEqual:
    bVar1 = cvm::BasicValue::operator>=(LHS,RHS);
    cvm::BasicValue::BasicValue(__return_storage_ptr__,bVar1);
    break;
  default:
    std::__cxx11::to_string(&local_128,LHS_local._4_4_);
    std::operator+(&local_108,&local_128," is not a valid binary relational operation kind");
    RuntimeError(this,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
  case Less:
    bVar1 = cvm::BasicValue::operator<(LHS,RHS);
    cvm::BasicValue::BasicValue(__return_storage_ptr__,bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

cvm::BasicValue
CMMInterpreter::evaluateBinRelation(BinaryOperatorAST::OperatorKind OpKind,
                                    cvm::BasicValue LHS, cvm::BasicValue RHS) {
  if (LHS.Type != RHS.Type) {
    if (LHS.isNumeric() && RHS.isNumeric()) {
      return evaluateBinRelation(OpKind, LHS.toDouble(), RHS.toDouble());
    }
    RuntimeError("relational operator should apply to identical type");
  }

  switch (OpKind) {
  default:
    RuntimeError(std::to_string(OpKind) +
        " is not a valid binary relational operation kind");
  case cmm::BinaryOperatorAST::Less:
    return LHS < RHS;
  case cmm::BinaryOperatorAST::LessEqual:
    return LHS <= RHS;
  case cmm::BinaryOperatorAST::Equal:
    return LHS == RHS;
  case cmm::BinaryOperatorAST::NotEqual:
    return LHS != RHS;
  case cmm::BinaryOperatorAST::Greater:
    return LHS > RHS;
  case cmm::BinaryOperatorAST::GreaterEqual:
    return LHS >= RHS;
  }
}